

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall FIX::double_conversion::StringBuilder::AddCharacter(StringBuilder *this,char c)

{
  int index;
  char *pcVar1;
  
  if (c == '\0') {
    __assert_fail("c != \'\\0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xf3,"void FIX::double_conversion::StringBuilder::AddCharacter(char)");
  }
  index = this->position_;
  if ((-1 < index) && (index < (this->buffer_).length_)) {
    this->position_ = index + 1;
    pcVar1 = Vector<char>::operator[](&this->buffer_,index);
    *pcVar1 = c;
    return;
  }
  __assert_fail("!is_finalized() && position_ < buffer_.length()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xf4,"void FIX::double_conversion::StringBuilder::AddCharacter(char)");
}

Assistant:

void AddCharacter(char c) {
    ASSERT(c != '\0');
    ASSERT(!is_finalized() && position_ < buffer_.length());
    buffer_[position_++] = c;
  }